

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O1

TraceGeodesicResult *
geometrycentral::surface::traceGeodesic
          (TraceGeodesicResult *__return_storage_ptr__,IntrinsicGeometryInterface *geom,
          Face startFace,Vector3 startBary,Vector3 traceBaryVec,TraceOptions *traceOptions)

{
  pointer *ppSVar1;
  bool bVar2;
  iterator __position;
  pointer puVar3;
  unsigned_long uVar4;
  Vector2 *pVVar5;
  unsigned_long uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  Vector3 startPoint;
  TraceSubResult prevTraceEnd_00;
  Vector3 vecBary;
  size_t i_1;
  runtime_error *this;
  size_t sVar13;
  ParentMeshT *pPVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  double dVar17;
  double vecCartesianLen;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  Vector2 vecCartesianDir;
  TraceSubResult prevTraceEnd;
  undefined1 local_d8 [16];
  double dStack_c8;
  double dStack_c0;
  double dStack_b8;
  double dStack_b0;
  ParentMeshT *pPStack_a8;
  size_t sStack_a0;
  ParentMeshT *local_98;
  double dStack_90;
  ParentMeshT *pPStack_88;
  size_t sStack_80;
  double dStack_78;
  ParentMeshT *pPStack_70;
  size_t sStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  
  sVar13 = startFace.
           super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind;
  pPVar14 = startFace.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
            mesh;
  IntrinsicGeometryInterface::requireVertexAngleSums(geom);
  IntrinsicGeometryInterface::requireHalfedgeVectorsInVertex(geom);
  IntrinsicGeometryInterface::requireHalfedgeVectorsInFace(geom);
  (__return_storage_ptr__->endPoint).type = Vertex;
  (__return_storage_ptr__->endPoint).vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)0x0;
  (__return_storage_ptr__->endPoint).vertex.
  super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       0xffffffffffffffff;
  (__return_storage_ptr__->endPoint).edge.
  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)0x0;
  (__return_storage_ptr__->endPoint).edge.
  super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
       0xffffffffffffffff;
  (__return_storage_ptr__->endPoint).tEdge = NAN;
  (__return_storage_ptr__->endPoint).face.
  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
       (ParentMeshT *)0x0;
  (__return_storage_ptr__->endPoint).face.
  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
       0xffffffffffffffff;
  (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
  (__return_storage_ptr__->endPoint).faceCoords.y = NAN;
  (__return_storage_ptr__->endPoint).faceCoords.z = NAN;
  (__return_storage_ptr__->pathPoints).
  super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pathPoints).
  super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->pathPoints).
  super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->hitBoundary = false;
  __return_storage_ptr__->hasPath = false;
  bVar2 = traceOptions->includePath;
  __return_storage_ptr__->hasPath = bVar2;
  if (bVar2 == true) {
    pPStack_88 = (ParentMeshT *)startBary.z;
    local_98 = (ParentMeshT *)startBary.x;
    dStack_90 = startBary.y;
    local_d8._0_4_ = 2;
    local_d8._8_8_ = 0;
    dStack_c8 = -NAN;
    dStack_c0 = 0.0;
    dStack_b8 = -NAN;
    dStack_b0 = NAN;
    __position._M_current =
         (__return_storage_ptr__->pathPoints).
         super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pPStack_a8 = pPVar14;
    sStack_a0 = sVar13;
    if (__position._M_current ==
        (__return_storage_ptr__->pathPoints).
        super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
      ::_M_realloc_insert<geometrycentral::surface::SurfacePoint>
                (&__return_storage_ptr__->pathPoints,__position,(SurfacePoint *)local_d8);
    }
    else {
      ((__position._M_current)->edge).
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      ((__position._M_current)->edge).
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__position._M_current)->tEdge = NAN;
      ((__position._M_current)->face).
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           pPVar14;
      ((__position._M_current)->face).
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           sVar13;
      ((__position._M_current)->faceCoords).x = startBary.x;
      ((__position._M_current)->faceCoords).y = startBary.y;
      ((__position._M_current)->faceCoords).z = startBary.z;
      *(undefined8 *)__position._M_current = local_d8._0_8_;
      ((__position._M_current)->vertex).
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      ((__position._M_current)->vertex).
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      ((__position._M_current)->edge).
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      ((__position._M_current)->edge).
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__position._M_current)->tEdge = NAN;
      ((__position._M_current)->face).
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           pPVar14;
      ((__position._M_current)->face).
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           sVar13;
      ppSVar1 = &(__return_storage_ptr__->pathPoints).
                 super__Vector_base<geometrycentral::surface::SurfacePoint,_std::allocator<geometrycentral::surface::SurfacePoint>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
  }
  auVar18._8_8_ = 0;
  auVar18._0_8_ = traceBaryVec.x;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = traceBaryVec.y * traceBaryVec.y;
  auVar18 = vfmadd231sd_fma(auVar23,auVar18,auVar18);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = traceBaryVec.z;
  auVar18 = vfmadd231sd_fma(auVar18,auVar21,auVar21);
  if ((auVar18._0_8_ != 0.0) || (NAN(auVar18._0_8_))) {
    dVar25 = dStack_c0;
    dStack_c8 = startBary.z;
    local_d8 = startBary._0_16_;
    auVar15._0_24_ = local_d8._0_24_;
    auVar15._24_8_ = 0;
    auVar15 = vmaxpd_avx(auVar15,ZEXT832(0) << 0x40);
    auVar16._0_24_ = auVar15._0_24_;
    auVar16._24_8_ = dVar25;
    local_d8._0_8_ = auVar15._0_8_;
    local_d8._8_8_ = auVar15._8_8_;
    dStack_c8 = auVar15._16_8_;
    dVar25 = (double)local_d8._0_8_ + (double)local_d8._8_8_ + dStack_c8;
    bVar2 = dVar25 == 0.0;
    dVar25 = 1.0 / dVar25;
    dVar7 = (double)local_d8._0_8_ * dVar25;
    dVar8 = (double)local_d8._8_8_ * dVar25;
    dVar25 = dStack_c8 * dVar25;
    dVar22 = (traceBaryVec.x + traceBaryVec.y + traceBaryVec.z) / 3.0;
    dVar10 = traceBaryVec.y - dVar22;
    dVar11 = traceBaryVec.z - dVar22;
    puVar3 = (pPVar14->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (pPVar14->fHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[sVar13];
    pVVar5 = (geom->halfedgeVectorsInFace).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar6 = puVar3[puVar3[uVar4]];
    dVar9 = (traceBaryVec.x - dVar22) * 0.0;
    dVar12 = (dVar9 + dVar10 * pVVar5[uVar4].x) - dVar11 * pVVar5[uVar6].x;
    dVar9 = (dVar9 + dVar10 * pVVar5[uVar4].y) - dVar11 * pVVar5[uVar6].y;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar9 * dVar9;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar12;
    auVar20 = vfmadd231sd_fma(auVar19,auVar24,auVar24);
    _local_d8 = auVar16;
    if (auVar20._0_8_ < 0.0) {
      dVar17 = sqrt(auVar20._0_8_);
      auVar20._8_8_ = 0;
    }
    else {
      auVar18 = vsqrtsd_avx(auVar20,auVar20);
      dVar17 = auVar18._0_8_;
    }
    if (auVar20._0_8_ < 0.0) {
      vecCartesianLen = sqrt(auVar20._0_8_);
    }
    else {
      auVar18 = vsqrtsd_avx(auVar20,auVar20);
      vecCartesianLen = auVar18._0_8_;
    }
    startPoint.y = (double)((ulong)bVar2 * 0x3fd5555555555555 + (ulong)!bVar2 * (long)dVar8);
    startPoint.x = (double)((ulong)bVar2 * 0x3fd5555555555555 + (ulong)!bVar2 * (long)dVar7);
    startPoint.z = (double)((ulong)bVar2 * 0x3fd5555555555555 + (ulong)!bVar2 * (long)dVar25);
    vecBary.y = dVar10;
    vecBary.x = traceBaryVec.x - dVar22;
    vecBary.z = dVar11;
    vecCartesianDir.y = dVar9 * (1.0 / dVar17);
    vecCartesianDir.x = dVar12 * (1.0 / dVar17);
    anon_unknown_2::traceInFaceBarycentric
              ((TraceSubResult *)local_d8,geom,startFace,startPoint,vecBary,vecCartesianDir,
               vecCartesianLen,(array<bool,_3UL>)0x10101,traceOptions);
    auVar15 = _local_d8;
    prevTraceEnd_00.traceVectorInHalfedgeDir.x = dStack_b8;
    prevTraceEnd_00.terminated = (bool)local_d8[0];
    prevTraceEnd_00._1_7_ = local_d8._1_7_;
    prevTraceEnd_00.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)local_d8._8_8_;
    prevTraceEnd_00.crossHe.
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)dStack_c8;
    prevTraceEnd_00.tCross = dStack_c0;
    prevTraceEnd_00.traceVectorInHalfedgeDir.y = dStack_b0;
    prevTraceEnd_00.traceVectorInHalfedgeLen = (double)pPStack_a8;
    prevTraceEnd_00.endPoint._0_8_ = sStack_a0;
    prevTraceEnd_00.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         local_98;
    prevTraceEnd_00.endPoint.vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)dStack_90;
    prevTraceEnd_00.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPStack_88;
    prevTraceEnd_00.endPoint.edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         sStack_80;
    prevTraceEnd_00.endPoint.tEdge = dStack_78;
    prevTraceEnd_00.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPStack_70;
    prevTraceEnd_00.endPoint.face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         sStack_68;
    prevTraceEnd_00.endPoint.faceCoords.x = dStack_60;
    prevTraceEnd_00.endPoint.faceCoords.y = dStack_58;
    prevTraceEnd_00.endPoint.faceCoords.z = dStack_50;
    prevTraceEnd_00.incomingDirToPoint.x = dStack_48;
    prevTraceEnd_00.incomingDirToPoint.y = dStack_40;
    _local_d8 = auVar15;
    anon_unknown_2::traceGeodesic_iterative
              (geom,__return_storage_ptr__,prevTraceEnd_00,traceOptions);
    IntrinsicGeometryInterface::unrequireVertexAngleSums(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInVertex(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInFace(geom);
  }
  else {
    IntrinsicGeometryInterface::unrequireVertexAngleSums(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInVertex(geom);
    IntrinsicGeometryInterface::unrequireHalfedgeVectorsInFace(geom);
    if (traceOptions->errorOnProblem == true) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this,"zero vec passed to trace, do something good here");
      __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    (__return_storage_ptr__->endingDir).x = 0.0;
    (__return_storage_ptr__->endingDir).y = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

TraceGeodesicResult traceGeodesic(IntrinsicGeometryInterface& geom, Face startFace, Vector3 startBary,
                                  Vector3 traceBaryVec, const TraceOptions& traceOptions) {


  geom.requireVertexAngleSums();
  geom.requireHalfedgeVectorsInVertex();
  geom.requireHalfedgeVectorsInFace();

  // The output data
  TraceGeodesicResult result;
  result.hasPath = traceOptions.includePath;
  if (traceOptions.includePath) {
    result.pathPoints.push_back(SurfacePoint(startFace, startBary));
  }

  if (TRACE_PRINT) {
    cout << "\n>>> Trace query (barycentric) from " << startFace << " " << startBary << " vec = " << traceBaryVec
         << endl;
  }

  // Early-out if zero
  if (traceBaryVec.norm2() == 0) {
    geom.unrequireVertexAngleSums();
    geom.unrequireHalfedgeVectorsInVertex();
    geom.unrequireHalfedgeVectorsInFace();

    // probably want to ensure we still return a point in a face...
    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("zero vec passed to trace, do something good here");
    }

    result.endingDir = Vector2::zero();
    return result;
  }

  // Make sure the input is sane
  startBary = projectInsideTriangle(startBary);
  traceBaryVec -= Vector3::constant(sum(traceBaryVec) / 3);

  // Construct the cartesian equivalent
  std::array<Vector2, 3> vertexCoords = vertexCoordinatesInTriangle(geom, startFace);
  Vector2 traceVectorCartesian = barycentricDisplacementToCartesian(vertexCoords, traceBaryVec);

  // Trace the first point starting inside the face
  TraceSubResult prevTraceEnd =
      traceInFaceBarycentric(geom, startFace, startBary, traceBaryVec, unit(traceVectorCartesian),
                             norm(traceVectorCartesian), {true, true, true}, traceOptions);

  // Keep tracing through triangles until finished
  traceGeodesic_iterative(geom, result, prevTraceEnd, traceOptions);

  geom.unrequireVertexAngleSums();
  geom.unrequireHalfedgeVectorsInVertex();
  geom.unrequireHalfedgeVectorsInFace();

  return result;
}